

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

RESULT_TYPE __thiscall
duckdb::Interpolator<true>::
InterpolateInternal<duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
          (Interpolator<true> *this,hugeint_t *v_t,QuantileDirect<duckdb::hugeint_t> *accessor)

{
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_> __comp;
  RESULT_TYPE RVar1;
  undefined7 uStack_17;
  
  __comp._17_7_ = uStack_17;
  __comp.desc = this->desc;
  __comp.accessor_r = accessor;
  __comp.accessor_l = accessor;
  ::std::
  nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp);
  RVar1.upper = v_t[this->FRN].upper;
  RVar1.lower = v_t[this->FRN].lower;
  return RVar1;
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}